

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openreadclose.c
# Opt level: O0

int openreadclose(char *fn,stralloc *sa,uint bufsize)

{
  int iVar1;
  int *piVar2;
  int fd;
  uint bufsize_local;
  stralloc *sa_local;
  char *fn_local;
  
  iVar1 = open_read(fn);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 == error_noent) {
      fn_local._4_4_ = 0;
    }
    else {
      fn_local._4_4_ = -1;
    }
  }
  else {
    iVar1 = readclose(iVar1,sa,bufsize);
    if (iVar1 == -1) {
      fn_local._4_4_ = -1;
    }
    else {
      fn_local._4_4_ = 1;
    }
  }
  return fn_local._4_4_;
}

Assistant:

int openreadclose(const char *fn,stralloc *sa,unsigned int bufsize)
{
  int fd;
  fd = open_read(fn);
  if (fd == -1) {
    if (errno == error_noent) return 0;
    return -1;
  }
  if (readclose(fd,sa,bufsize) == -1) return -1;
  return 1;
}